

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O2

void sync_queries(vw *all,svm_params *params,bool *train_pool)

{
  flat_example *__ptr;
  vw *all_00;
  int iVar1;
  io_buf *this;
  unsigned_long *buffer;
  char *buffer_00;
  svm_example *psVar2;
  size_t i;
  ulong uVar3;
  size_t nmemb;
  char *pcVar4;
  unsigned_long uVar5;
  char *pcVar6;
  flat_example *fec;
  vw *local_48;
  v_array<char> *local_40;
  bool *local_38;
  
  local_48 = all;
  this = (io_buf *)operator_new(0xa8);
  io_buf::io_buf(this);
  fec = (flat_example *)0x0;
  for (uVar3 = 0; all_00 = local_48, uVar3 < params->pool_pos; uVar3 = uVar3 + 1) {
    if (train_pool[uVar3] == true) {
      fec = &params->pool[uVar3]->ex;
      save_load_flat_example(this,false,&fec);
      psVar2 = params->pool[uVar3];
      if (psVar2 != (svm_example *)0x0) {
        svm_example::~svm_example(psVar2);
      }
      operator_delete(psVar2);
    }
  }
  local_38 = train_pool;
  buffer = calloc_or_throw<unsigned_long>(local_48->all_reduce->total);
  local_40 = &this->space;
  buffer[all_00->all_reduce->node] = (long)this->head - (long)(this->space)._begin;
  all_reduce<unsigned_long,_&add_size_t>(all_00,buffer,all_00->all_reduce->total);
  pcVar6 = (char *)0x0;
  nmemb = 0;
  for (uVar3 = 0; all_00->all_reduce->total != uVar3; uVar3 = uVar3 + 1) {
    uVar5 = 0;
    if (uVar3 <= all_00->all_reduce->node - 1) {
      uVar5 = buffer[uVar3];
    }
    pcVar6 = pcVar6 + uVar5;
    nmemb = nmemb + buffer[uVar3];
  }
  if (nmemb != 0) {
    buffer_00 = calloc_or_throw<char>(nmemb);
    pcVar4 = (this->space)._begin;
    memcpy(buffer_00 + (long)pcVar6,pcVar4,(long)this->head - (long)pcVar4);
    v_array<char>::delete_v(local_40);
    all_reduce<char,_&copy_char>(local_48,buffer_00,nmemb);
    (this->space)._begin = buffer_00;
    this->head = buffer_00;
    (this->space)._end = buffer_00 + nmemb;
    params->pool_pos = 0;
    pcVar4 = (char *)0x0;
    for (uVar3 = 0; uVar3 < params->pool_size; uVar3 = uVar3 + 1) {
      iVar1 = save_load_flat_example(this,true,&fec);
      if (iVar1 != 0) break;
      psVar2 = calloc_or_throw<svm_example>();
      __ptr = fec;
      params->pool[uVar3] = psVar2;
      memcpy(&params->pool[uVar3]->ex,fec,200);
      free(__ptr);
      local_38[uVar3] = true;
      params->pool_pos = params->pool_pos + 1;
      pcVar4 = this->head + ((long)pcVar4 - (long)(this->space)._begin);
      if (pcVar4 == pcVar6) {
        params->local_begin = uVar3 + 1;
      }
      if (pcVar4 == pcVar6 + buffer[local_48->all_reduce->node]) {
        params->local_end = uVar3;
      }
    }
  }
  free(fec);
  free(buffer);
  (*this->_vptr_io_buf[3])(this);
  return;
}

Assistant:

void sync_queries(vw& all, svm_params& params, bool* train_pool)
{
  io_buf* b = new io_buf();

  char* queries;
  flat_example* fec = nullptr;

  for (size_t i = 0; i < params.pool_pos; i++)
  {
    if (!train_pool[i])
      continue;

    fec = &(params.pool[i]->ex);
    save_load_flat_example(*b, false, fec);
    delete params.pool[i];
  }

  size_t* sizes = calloc_or_throw<size_t>(all.all_reduce->total);
  sizes[all.all_reduce->node] = b->head - b->space.begin();
  // params.all->opts_n_args.trace_message<<"Sizes = "<<sizes[all.node]<<" ";
  all_reduce<size_t, add_size_t>(all, sizes, all.all_reduce->total);

  size_t prev_sum = 0, total_sum = 0;
  for (size_t i = 0; i < all.all_reduce->total; i++)
  {
    if (i <= (all.all_reduce->node - 1))
      prev_sum += sizes[i];
    total_sum += sizes[i];
  }

  // params.all->opts_n_args.trace_message<<total_sum<<" "<<prev_sum<<endl;
  if (total_sum > 0)
  {
    queries = calloc_or_throw<char>(total_sum);
    memcpy(queries + prev_sum, b->space.begin(), b->head - b->space.begin());
    b->space.delete_v();
    all_reduce<char, copy_char>(all, queries, total_sum);

    b->space.begin() = queries;
    b->head = b->space.begin();
    b->space.end() = &queries[total_sum * sizeof(char)];

    size_t num_read = 0;
    params.pool_pos = 0;

    for (size_t i = 0; i < params.pool_size; i++)
    {
      if (!save_load_flat_example(*b, true, fec))
      {
        params.pool[i] = &calloc_or_throw<svm_example>();
        params.pool[i]->init_svm_example(fec);
        train_pool[i] = true;
        params.pool_pos++;
        // for(int j = 0;j < fec->feature_map_len;j++)
        //   params.all->opts_n_args.trace_message<<fec->feature_map[j].weight_index<<":"<<fec->feature_map[j].x<<" ";
        // params.all->opts_n_args.trace_message<<endl;
        // params.pool[i]->in_use = true;
        // params.current_t += ((label_data*) params.pool[i]->ld)->weight;
        // params.pool[i]->example_t = params.current_t;
      }
      else
        break;

      num_read += b->head - b->space.begin();
      if (num_read == prev_sum)
        params.local_begin = i + 1;
      if (num_read == prev_sum + sizes[all.all_reduce->node])
        params.local_end = i;
    }
  }
  if (fec)
    free(fec);
  free(sizes);
  delete b;
}